

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfdcapi_common_CfdEncodeDecodeBase64_Test::TestBody(cfdcapi_common_CfdEncodeDecodeBase64_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *exp;
  char *target_data;
  char *output;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffdf8;
  AssertionResult *in_stack_fffffffffffffe00;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  char *in_stack_fffffffffffffe10;
  AssertionResult *in_stack_fffffffffffffe18;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  AssertionResult local_108;
  AssertHelper local_f8;
  Message local_f0;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 uVar3;
  char *in_stack_ffffffffffffff40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff48;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)in_stack_fffffffffffffe18);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffe18->success_,in_stack_fffffffffffffe10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (int *)in_stack_fffffffffffffe00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3330ca);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x235,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x33312d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x333182);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(type *)0x3331b3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x236,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3332ac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x333327);
  local_14 = CfdEncodeBase64(in_stack_ffffffffffffff48.ptr_,in_stack_ffffffffffffff40,
                             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
  ;
  uVar3 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffe18->success_,in_stack_fffffffffffffe10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (int *)in_stack_fffffffffffffe00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff40);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x333416);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x23c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x333473);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3334c8);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_e8,"exp","output",
               "VGhlIHF1aWNrIGJyb3duIGZveCBqdW1wcyBvdmVyIDEzIGxhenkgZG9ncy4=",(char *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33356c);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x23e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message((Message *)0x3335c9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33361e);
    CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
  }
  local_14 = CfdDecodeBase64(in_stack_ffffffffffffff48.ptr_,in_stack_ffffffffffffff40,
                             (char **)CONCAT44(uVar3,in_stack_ffffffffffffff38));
  local_10c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffe18->success_,in_stack_fffffffffffffe10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (int *)in_stack_fffffffffffffe00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3336fe);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x244,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message((Message *)0x33375b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3337b0);
  if (local_14 == 0) {
    in_stack_fffffffffffffe18 = &local_130;
    testing::internal::CmpHelperSTREQ
              ((internal *)in_stack_fffffffffffffe18,"target_data","output",
               "54686520717569636b2062726f776e20666f78206a756d7073206f766572203133206c617a7920646f67732e"
               ,(char *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffe18);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      in_stack_fffffffffffffe10 =
           testing::AssertionResult::failure_message((AssertionResult *)0x333854);
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x246,in_stack_fffffffffffffe10);
      testing::internal::AssertHelper::operator=(&local_140,&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      testing::Message::~Message((Message *)0x3338b1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x333906);
    CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
  }
  local_14 = CfdFreeHandle((void *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
  local_154 = 0;
  this_00 = &local_150;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffe18->success_,in_stack_fffffffffffffe10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3339d6);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x24c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message((Message *)0x333a31);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x333a86);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdEncodeDecodeBase64) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* output = nullptr;
  const char* target_data = "54686520717569636b2062726f776e20666f78206a756d7073206f766572203133206c617a7920646f67732e";
  const char* exp = "VGhlIHF1aWNrIGJyb3duIGZveCBqdW1wcyBvdmVyIDEzIGxhenkgZG9ncy4=";
  ret = CfdEncodeBase64(handle, target_data, &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(exp, output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdDecodeBase64(handle, exp, &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(target_data, output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}